

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

Am_Value add_offset(Am_Value *v,Am_Value *delta,Direction d,Am_Value *ref,float attenuation)

{
  bool bVar1;
  uint uVar2;
  Am_Value *pAVar3;
  Am_Wrapper *initial;
  ostream *poVar4;
  undefined4 in_register_00000014;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  anon_union_8_8_ea4c8939_for_value aVar5;
  Am_Value *in_R8;
  float fVar6;
  float fVar7;
  Am_Value AVar8;
  float local_118;
  float local_114;
  Am_Value local_e0;
  Am_Value local_d0;
  Am_Value local_c0;
  Am_Value local_b0;
  undefined1 local_a0 [8];
  Am_Value_List result;
  Am_Value_List lref;
  undefined1 local_70 [8];
  Am_Value_List ldelta;
  Am_Value_List lv;
  float fref_1;
  float fd_1;
  float fv_1;
  float fref;
  float fd;
  float fv;
  float attenuation_local;
  Am_Value *ref_local;
  Direction d_local;
  Am_Value *delta_local;
  Am_Value *v_local;
  
  pAVar3 = (Am_Value *)CONCAT44(in_register_00000014,d);
  uVar2 = (uint)delta->type;
  if (uVar2 - 2 < 2) {
    local_114 = Am_Value::operator_cast_to_float(delta);
    fVar6 = Am_Value::operator_cast_to_float(pAVar3);
    fVar7 = Am_Value::operator_cast_to_float(in_R8);
    if (((int)ref == 0) == local_114 < fVar7) {
      local_114 = local_114 - fVar6 * attenuation;
    }
    else {
      local_114 = local_114 + fVar6 * attenuation;
    }
    Am_Value::Am_Value(v,(int)local_114);
    aVar5 = extraout_RDX;
  }
  else if (uVar2 == 5) {
    local_118 = Am_Value::operator_cast_to_float(delta);
    fVar6 = Am_Value::operator_cast_to_float(pAVar3);
    fVar7 = Am_Value::operator_cast_to_float(in_R8);
    if (((int)ref == 0) == local_118 < fVar7) {
      local_118 = local_118 - fVar6 * attenuation;
    }
    else {
      local_118 = local_118 + fVar6 * attenuation;
    }
    Am_Value::Am_Value(v,local_118);
    aVar5 = extraout_RDX_00;
  }
  else {
    if ((uVar2 != 0x2000) || (bVar1 = Am_Value_List::Test(delta), !bVar1)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar4 = std::operator<<(poVar4,"Exaggerated_Animator can\'t handle type of ");
      poVar4 = operator<<(poVar4,delta);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Value_List::Am_Value_List((Am_Value_List *)&ldelta.item,delta);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_70,pAVar3);
    Am_Value_List::Am_Value_List((Am_Value_List *)&result.item,in_R8);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_a0);
    Am_Value_List::Start((Am_Value_List *)&ldelta.item);
    Am_Value_List::Start((Am_Value_List *)local_70);
    Am_Value_List::Start((Am_Value_List *)&result.item);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)&ldelta.item), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&ldelta.item);
      Am_Value::Am_Value(&local_c0,pAVar3);
      pAVar3 = Am_Value_List::Get((Am_Value_List *)local_70);
      Am_Value::Am_Value(&local_d0,pAVar3);
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&result.item);
      Am_Value::Am_Value(&local_e0,pAVar3);
      add_offset(&local_b0,&local_c0,(Direction)&local_d0,(Am_Value *)((ulong)ref & 0xffffffff),
                 attenuation);
      Am_Value_List::Add((Am_Value_List *)local_a0,&local_b0,Am_TAIL,true);
      Am_Value::~Am_Value(&local_b0);
      Am_Value::~Am_Value(&local_e0);
      Am_Value::~Am_Value(&local_d0);
      Am_Value::~Am_Value(&local_c0);
      Am_Value_List::Next((Am_Value_List *)&ldelta.item);
      Am_Value_List::Next((Am_Value_List *)local_70);
      Am_Value_List::Next((Am_Value_List *)&result.item);
    }
    initial = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_a0);
    Am_Value::Am_Value(v,initial);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_a0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&result.item);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_70);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&ldelta.item);
    aVar5 = extraout_RDX_01;
  }
  AVar8.value.wrapper_value = aVar5.wrapper_value;
  AVar8._0_8_ = v;
  return AVar8;
}

Assistant:

Am_Value
add_offset(Am_Value v, Am_Value delta, Direction d, Am_Value ref,
           float attenuation = 1.0)
{
  switch (v.type) {
  case Am_INT:
  case Am_LONG: {
    float fv = v;
    float fd = ((float)delta) * attenuation;
    float fref = ref;

    return (int)(((int)(d == AWAYFROM) ^ (int)(fv < fref)) ? fv + fd : fv - fd);
  }

  case Am_FLOAT: {
    float fv = v;
    float fd = ((float)delta) * attenuation;
    float fref = ref;

    return ((int)(d == AWAYFROM) ^ (int)(fv < fref)) ? fv + fd : fv - fd;
  }
  case Am_WRAPPER:
    if (Am_Value_List::Test(v)) {
      Am_Value_List lv = v;
      Am_Value_List ldelta = delta;
      Am_Value_List lref = ref;
      Am_Value_List result;

      for (lv.Start(), ldelta.Start(), lref.Start(); !lv.Last();
           lv.Next(), ldelta.Next(), lref.Next())
        result.Add(
            add_offset(lv.Get(), ldelta.Get(), d, lref.Get(), attenuation));
      return Am_Value(result);
    }
  // else fall through
  default:
    Am_ERROR("Exaggerated_Animator can't handle type of " << v);
    return Am_No_Value;
  }
}